

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O1

rb_tree_node_base *
nestl::impl::detail::rb_tree_rebalance_for_erase(rb_tree_node_base *z,rb_tree_node_base *header)

{
  base_ptr *pprVar1;
  rb_tree_color rVar2;
  rb_tree_node_base *prVar3;
  base_ptr prVar4;
  bool bVar5;
  rb_tree_node_base *prVar6;
  base_ptr prVar7;
  rb_tree_node_base *prVar8;
  base_ptr *pprVar9;
  base_ptr prVar10;
  rb_tree_node_base *prVar11;
  rb_tree_node_base *y_1;
  
  prVar8 = z->m_left;
  prVar3 = z->m_right;
  prVar6 = prVar3;
  prVar11 = z;
  if ((prVar8 != (rb_tree_node_base *)0x0) && (prVar6 = prVar8, prVar3 != (rb_tree_node_base *)0x0))
  {
    do {
      prVar11 = prVar3;
      prVar3 = prVar11->m_left;
    } while (prVar11->m_left != (base_ptr)0x0);
    prVar6 = prVar11->m_right;
  }
  pprVar1 = &header->m_parent;
  if (prVar11 == z) {
    prVar7 = prVar11->m_parent;
    if (prVar6 != (rb_tree_node_base *)0x0) {
      prVar6->m_parent = prVar7;
    }
    pprVar9 = pprVar1;
    if (*pprVar1 != z) {
      prVar10 = z->m_parent;
      pprVar9 = &prVar10->m_right;
      if (prVar10->m_left == z) {
        pprVar9 = &prVar10->m_left;
      }
    }
    *pprVar9 = prVar6;
    if (header->m_left == z) {
      if (z->m_right == (base_ptr)0x0) {
        prVar8 = z->m_parent;
      }
      else {
        prVar10 = prVar6;
        if (prVar6 == (rb_tree_node_base *)0x0) {
          __assert_fail("x",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/detail/red_black_tree.hpp"
                        ,0x2d,
                        "static base_ptr nestl::impl::detail::rb_tree_node_base::s_minimum(base_ptr)"
                       );
        }
        do {
          prVar8 = prVar10;
          prVar10 = prVar8->m_left;
        } while (prVar8->m_left != (base_ptr)0x0);
      }
      header->m_left = prVar8;
    }
    if (header->m_right == z) {
      if (z->m_left == (base_ptr)0x0) {
        header->m_right = z->m_parent;
      }
      else {
        prVar10 = prVar6;
        if (prVar6 == (rb_tree_node_base *)0x0) {
          __assert_fail("x",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/detail/red_black_tree.hpp"
                        ,0x42,
                        "static base_ptr nestl::impl::detail::rb_tree_node_base::s_maximum(base_ptr)"
                       );
        }
        do {
          prVar8 = prVar10;
          prVar10 = prVar8->m_right;
        } while (prVar10 != (base_ptr)0x0);
        header->m_right = prVar8;
      }
    }
  }
  else {
    prVar8->m_parent = prVar11;
    prVar11->m_left = prVar8;
    prVar8 = z->m_right;
    prVar7 = prVar11;
    if (prVar11 != prVar8) {
      prVar7 = prVar11->m_parent;
      if (prVar6 != (rb_tree_node_base *)0x0) {
        prVar6->m_parent = prVar7;
      }
      prVar11->m_parent->m_left = prVar6;
      prVar11->m_right = prVar8;
      z->m_right->m_parent = prVar11;
    }
    pprVar9 = pprVar1;
    if (*pprVar1 != z) {
      prVar10 = z->m_parent;
      pprVar9 = &prVar10->m_right;
      if (prVar10->m_left == z) {
        pprVar9 = &prVar10->m_left;
      }
    }
    *pprVar9 = prVar11;
    prVar11->m_parent = z->m_parent;
    rVar2 = prVar11->m_color;
    prVar11->m_color = z->m_color;
    z->m_color = rVar2;
    prVar11 = z;
  }
  if (prVar11->m_color != rb_red) {
    do {
      if ((prVar6 == *pprVar1) ||
         ((prVar6 != (rb_tree_node_base *)0x0 && (prVar6->m_color != rb_black)))) break;
      prVar8 = prVar7->m_left;
      if (prVar6 == prVar8) {
        prVar8 = prVar7->m_right;
        if (prVar8->m_color == rb_red) {
          prVar8->m_color = rb_black;
          prVar7->m_color = rb_red;
          prVar10 = prVar8->m_left;
          prVar7->m_right = prVar10;
          if (prVar10 != (base_ptr)0x0) {
            prVar10->m_parent = prVar7;
          }
          prVar8->m_parent = prVar7->m_parent;
          pprVar9 = pprVar1;
          if (*pprVar1 != prVar7) {
            prVar10 = prVar7->m_parent;
            pprVar9 = &prVar10->m_right;
            if (prVar10->m_left == prVar7) {
              pprVar9 = &prVar10->m_left;
            }
          }
          *pprVar9 = prVar8;
          prVar8->m_left = prVar7;
          prVar7->m_parent = prVar8;
          prVar8 = prVar7->m_right;
        }
        prVar10 = prVar8->m_left;
        if (((prVar10 != (base_ptr)0x0) && (prVar10->m_color != rb_black)) ||
           ((prVar8->m_right != (base_ptr)0x0 && (prVar8->m_right->m_color != rb_black)))) {
          if ((prVar8->m_right == (base_ptr)0x0) || (prVar8->m_right->m_color == rb_black)) {
            prVar10->m_color = rb_black;
            prVar8->m_color = rb_red;
            prVar4 = prVar10->m_right;
            prVar8->m_left = prVar4;
            if (prVar4 != (base_ptr)0x0) {
              prVar4->m_parent = prVar8;
            }
            prVar10->m_parent = prVar8->m_parent;
            pprVar9 = pprVar1;
            if (*pprVar1 != prVar8) {
              prVar4 = prVar8->m_parent;
              pprVar9 = &prVar4->m_left;
              if (prVar4->m_right == prVar8) {
                pprVar9 = &prVar4->m_right;
              }
            }
            *pprVar9 = prVar10;
            prVar10->m_right = prVar8;
            prVar8->m_parent = prVar10;
            prVar8 = prVar7->m_right;
          }
          prVar8->m_color = prVar7->m_color;
          prVar7->m_color = rb_black;
          if (prVar8->m_right != (base_ptr)0x0) {
            prVar8->m_right->m_color = rb_black;
          }
          prVar10 = prVar7->m_right;
          prVar4 = prVar10->m_left;
          prVar7->m_right = prVar4;
          if (prVar4 != (base_ptr)0x0) {
            prVar4->m_parent = prVar7;
          }
          prVar10->m_parent = prVar7->m_parent;
          pprVar9 = pprVar1;
          if (*pprVar1 != prVar7) {
            prVar4 = prVar7->m_parent;
            pprVar9 = &prVar4->m_right;
            if (prVar4->m_left == prVar7) {
              pprVar9 = &prVar4->m_left;
            }
          }
          *pprVar9 = prVar10;
          prVar10->m_left = prVar7;
          goto LAB_0010992b;
        }
LAB_0010985b:
        prVar8->m_color = rb_red;
        prVar8 = prVar7->m_parent;
        bVar5 = true;
        prVar6 = prVar7;
      }
      else {
        if (prVar8->m_color == rb_red) {
          prVar8->m_color = rb_black;
          prVar7->m_color = rb_red;
          prVar10 = prVar8->m_right;
          prVar7->m_left = prVar10;
          if (prVar10 != (base_ptr)0x0) {
            prVar10->m_parent = prVar7;
          }
          prVar8->m_parent = prVar7->m_parent;
          pprVar9 = pprVar1;
          if (*pprVar1 != prVar7) {
            prVar10 = prVar7->m_parent;
            pprVar9 = &prVar10->m_left;
            if (prVar10->m_right == prVar7) {
              pprVar9 = &prVar10->m_right;
            }
          }
          *pprVar9 = prVar8;
          prVar8->m_right = prVar7;
          prVar7->m_parent = prVar8;
          prVar8 = prVar7->m_left;
        }
        prVar10 = prVar8->m_right;
        if (((prVar10 == (base_ptr)0x0) || (prVar10->m_color == rb_black)) &&
           ((prVar8->m_left == (base_ptr)0x0 || (prVar8->m_left->m_color == rb_black))))
        goto LAB_0010985b;
        if ((prVar8->m_left == (base_ptr)0x0) || (prVar8->m_left->m_color == rb_black)) {
          prVar10->m_color = rb_black;
          prVar8->m_color = rb_red;
          prVar4 = prVar10->m_left;
          prVar8->m_right = prVar4;
          if (prVar4 != (base_ptr)0x0) {
            prVar4->m_parent = prVar8;
          }
          prVar10->m_parent = prVar8->m_parent;
          pprVar9 = pprVar1;
          if (*pprVar1 != prVar8) {
            prVar4 = prVar8->m_parent;
            pprVar9 = &prVar4->m_right;
            if (prVar4->m_left == prVar8) {
              pprVar9 = &prVar4->m_left;
            }
          }
          *pprVar9 = prVar10;
          prVar10->m_left = prVar8;
          prVar8->m_parent = prVar10;
          prVar8 = prVar7->m_left;
        }
        prVar8->m_color = prVar7->m_color;
        prVar7->m_color = rb_black;
        if (prVar8->m_left != (base_ptr)0x0) {
          prVar8->m_left->m_color = rb_black;
        }
        prVar10 = prVar7->m_left;
        prVar4 = prVar10->m_right;
        prVar7->m_left = prVar4;
        if (prVar4 != (base_ptr)0x0) {
          prVar4->m_parent = prVar7;
        }
        prVar10->m_parent = prVar7->m_parent;
        pprVar9 = pprVar1;
        if (*pprVar1 != prVar7) {
          prVar4 = prVar7->m_parent;
          pprVar9 = &prVar4->m_left;
          if (prVar4->m_right == prVar7) {
            pprVar9 = &prVar4->m_right;
          }
        }
        *pprVar9 = prVar10;
        prVar10->m_right = prVar7;
LAB_0010992b:
        prVar7->m_parent = prVar10;
        bVar5 = false;
        prVar8 = prVar7;
      }
      prVar7 = prVar8;
    } while (bVar5);
    if (prVar6 != (rb_tree_node_base *)0x0) {
      prVar6->m_color = rb_black;
    }
  }
  return prVar11;
}

Assistant:

inline rb_tree_node_base*
rb_tree_rebalance_for_erase(rb_tree_node_base* const z,
                            rb_tree_node_base& header) NESTL_NOEXCEPT_SPEC
{
    rb_tree_node_base *& root = header.m_parent;
    rb_tree_node_base *& leftmost = header.m_left;
    rb_tree_node_base *& rightmost = header.m_right;
    rb_tree_node_base* y = z;
    rb_tree_node_base* x = 0;
    rb_tree_node_base* x_parent = 0;

    if (y->m_left == 0)     // z has at most one non-null child. y == z.
        x = y->m_right;     // x might be null.
    else
        if (y->m_right == 0)  // z has exactly one non-null child. y == z.
            x = y->m_left;    // x is not null.
        else
        {
            // z has two non-null children.  Set y to
            y = y->m_right;   //   z's successor.  x might be null.
            while (y->m_left != 0)
                y = y->m_left;
            x = y->m_right;
        }
    if (y != z)
    {
        // relink y in place of z.  y is z's successor
        z->m_left->m_parent = y;
        y->m_left = z->m_left;
        if (y != z->m_right)
        {
            x_parent = y->m_parent;
            if (x) x->m_parent = y->m_parent;
            y->m_parent->m_left = x;   // y must be a child of m_left
            y->m_right = z->m_right;
            z->m_right->m_parent = y;
        }
        else
            x_parent = y;
        if (root == z)
            root = y;
        else if (z->m_parent->m_left == z)
            z->m_parent->m_left = y;
        else
            z->m_parent->m_right = y;
        y->m_parent = z->m_parent;
        std::swap(y->m_color, z->m_color);
        y = z;
        // y now points to node to be actually deleted
    }
    else
    {                        // y == z
        x_parent = y->m_parent;
        if (x)
            x->m_parent = y->m_parent;
        if (root == z)
            root = x;
        else
            if (z->m_parent->m_left == z)
                z->m_parent->m_left = x;
            else
                z->m_parent->m_right = x;
        if (leftmost == z)
        {
            if (z->m_right == 0)        // z->m_left must be null also
                leftmost = z->m_parent;
            // makes leftmost == _M_header if z == root
            else
                leftmost = rb_tree_node_base::s_minimum(x);
        }
        if (rightmost == z)
        {
            if (z->m_left == 0)         // z->m_right must be null also
                rightmost = z->m_parent;
            // makes rightmost == _M_header if z == root
            else                      // x == z->m_left
                rightmost = rb_tree_node_base::s_maximum(x);
        }
    }
    if (y->m_color != rb_red)
      {
    while (x != root && (x == 0 || x->m_color == rb_black))
      if (x == x_parent->m_left)
        {
          rb_tree_node_base* w = x_parent->m_right;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_left(x_parent, root);
          w = x_parent->m_right;
        }
          if ((w->m_left == 0 ||
           w->m_left->m_color == rb_black) &&
          (w->m_right == 0 ||
           w->m_right->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_right == 0
              || w->m_right->m_color == rb_black)
            {
              w->m_left->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_right(w, root);
              w = x_parent->m_right;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_right)
            w->m_right->m_color = rb_black;
          local_rb_tree_rotate_left(x_parent, root);
          break;
        }
        }
      else
        {
          // same as above, with m_right <-> m_left.
          rb_tree_node_base* w = x_parent->m_left;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_right(x_parent, root);
          w = x_parent->m_left;
        }
          if ((w->m_right == 0 ||
           w->m_right->m_color == rb_black) &&
          (w->m_left == 0 ||
           w->m_left->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_left == 0 || w->m_left->m_color == rb_black)
            {
              w->m_right->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_left(w, root);
              w = x_parent->m_left;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_left)
            w->m_left->m_color = rb_black;
          local_rb_tree_rotate_right(x_parent, root);
          break;
        }
        }
    if (x) x->m_color = rb_black;
      }
    return y;
  }